

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::CentroidQualifierAtSampleCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ostream *poVar1;
  RenderContext *pRVar2;
  ContextType local_1cc;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  CentroidQualifierAtSampleCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec3 v_barycentricsA;\ncentroid in highp vec3 v_barycentricsB;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.0005;\n\tbool allOk = true;\n\n\tfor (int sampleNdx = 0; sampleNdx < "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,numTargetSamples);
  std::operator<<(poVar1,
                  "; ++sampleNdx)\n\t{\n\t\thighp vec3 sampleA = interpolateAtSample(v_barycentricsA, sampleNdx);\n\t\thighp vec3 sampleB = interpolateAtSample(v_barycentricsB, sampleNdx);\n\t\tbool valuesEqual = all(lessThan(abs(sampleA - sampleB), vec3(threshold)));\n\t\tif (!valuesEqual)\n\t\t\tallOk = false;\n\t}\n\n\tif (allOk)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  pRVar2 = Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1cc.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string CentroidQualifierAtSampleCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
			"in highp vec3 v_barycentricsA;\n"
			"centroid in highp vec3 v_barycentricsB;\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.0005;\n"
			"	bool allOk = true;\n"
			"\n"
			"	for (int sampleNdx = 0; sampleNdx < " << numTargetSamples << "; ++sampleNdx)\n"
			"	{\n"
			"		highp vec3 sampleA = interpolateAtSample(v_barycentricsA, sampleNdx);\n"
			"		highp vec3 sampleB = interpolateAtSample(v_barycentricsB, sampleNdx);\n"
			"		bool valuesEqual = all(lessThan(abs(sampleA - sampleB), vec3(threshold)));\n"
			"		if (!valuesEqual)\n"
			"			allOk = false;\n"
			"	}\n"
			"\n"
			"	if (allOk)\n"
			"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}